

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,GenericForStatement *gen_for,void *data)

{
  size_t *psVar1;
  int line;
  uint uVar2;
  SyntaxTree *pSVar3;
  Function *this_00;
  GenerateFunction *pGVar4;
  GenericForStatement *pGVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  size_t sVar11;
  _List_node_base *p_Var12;
  int iVar13;
  int iVar14;
  Guard g_1;
  NameListData_conflict name_list_data;
  Guard l;
  ExpListData_conflict exp_list_data;
  Guard g;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  undefined8 local_c8;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  GenericForStatement *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  uint local_58;
  int local_54;
  Guard local_50;
  
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
             ::_M_manager;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  local_98._M_unused._M_object = this;
  Guard::Guard(&local_50,(function<void_()> *)&local_98,(function<void_()> *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  uVar6 = GenerateRegisterId(this);
  uVar7 = GenerateRegisterId(this);
  local_54 = GenerateRegisterId(this);
  local_c8 = CONCAT44(extraout_var,local_54);
  local_54 = local_54 + 1;
  pSVar3 = (gen_for->exp_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  local_58 = uVar6;
  (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
  this_00 = this->current_function_->function_;
  line = gen_for->line_;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
             ::_M_manager;
  local_c0._8_8_ = 0;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  local_e8._8_8_ = gen_for;
  local_c0._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_98,(function<void_()> *)&local_e8,(function<void_()> *)&local_c0);
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_c0._8_8_ = 0;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
             ::_M_manager;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
             ::_M_manager;
  local_c0._M_unused._M_object = this;
  local_78._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_e8,(function<void_()> *)&local_c0,(function<void_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  uVar2 = this->current_function_->register_id_;
  local_c0._M_unused._M_member_pointer = local_c0._M_unused._M_member_pointer & 0xffffffffffffff00;
  pSVar3 = (gen_for->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  local_a0 = gen_for;
  (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
  iVar13 = this->current_function_->register_id_;
  iVar14 = iVar13 - uVar2;
  if (iVar14 != 0 && (int)uVar2 <= iVar13) {
    uVar8 = GenerateRegisterId(this);
    uVar9 = GenerateRegisterId(this);
    uVar10 = GenerateRegisterId(this);
    iVar13 = (uVar8 & 0xff) * 0x10000;
    Function::AddInstruction
              (this_00,(Instruction)((uVar6 & 0xff) * 0x100 + iVar13 + 0x6000000),line);
    Function::AddInstruction
              (this_00,(Instruction)((uVar7 & 0xff) * 0x100 + (uVar9 & 0xff) * 0x10000 + 0x6000000),
               line);
    Function::AddInstruction
              (this_00,(Instruction)
                       (((uint)local_c8 & 0xff) * 0x100 + (uVar10 & 0xff) * 0x10000 + 0x6000000),
               line);
    Function::AddInstruction(this_00,(Instruction)((iVar14 + 1U & 0xff) + iVar13 + 0xc000300),line);
    uVar8 = uVar8 << 8;
    uVar6 = uVar2 << 0x10;
    do {
      Function::AddInstruction
                (this_00,(Instruction)((uVar6 & 0xff0000) + (uVar8 & 0xff00) + 0x6000000),line);
      uVar8 = uVar8 + 0x100;
      uVar6 = uVar6 + 0x10000;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    sVar11 = Function::AddInstruction
                       (this_00,(Instruction)((uVar2 & 0xff) << 0x10 | 0x11000000),line);
    pGVar5 = local_a0;
    pGVar4 = this->current_function_;
    p_Var12 = (_List_node_base *)operator_new(0x20);
    p_Var12[1]._M_next = (_List_node_base *)pGVar5;
    *(undefined4 *)&p_Var12[1]._M_prev = 1;
    *(int *)((long)&p_Var12[1]._M_prev + 4) = (int)sVar11;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = &(pGVar4->loop_jumps_).
              super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    Function::AddInstruction
              (this_00,(Instruction)
                       ((uint)(byte)local_c8 * 0x10000 + (uVar2 & 0xff) * 0x100 + 0x6000000),line);
    pSVar3 = (pGVar5->block_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this,0);
    Guard::~Guard((Guard *)&local_e8);
    sVar11 = Function::AddInstruction(this_00,(Instruction)0x12000000,line);
    pGVar4 = this->current_function_;
    p_Var12 = (_List_node_base *)operator_new(0x20);
    p_Var12[1]._M_next = (_List_node_base *)pGVar5;
    *(undefined4 *)&p_Var12[1]._M_prev = 0;
    *(int *)((long)&p_Var12[1]._M_prev + 4) = (int)sVar11;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = &(pGVar4->loop_jumps_).
              super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    Guard::~Guard((Guard *)&local_98);
    Guard::~Guard(&local_50);
    return;
  }
  __assert_fail("name_start < name_end",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x3c7,
                "virtual void luna::CodeGenerateVisitor::Visit(GenericForStatement *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(GenericForStatement *gen_for, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

        // Init generic for statement data
        auto func_register = GenerateRegisterId();
        auto state_register = GenerateRegisterId();
        auto var_register = GenerateRegisterId();
        ExpListData exp_list_data{ func_register, var_register + 1 };
        gen_for->exp_list_->Accept(this, &exp_list_data);

        auto function = GetCurrentFunction();
        auto line = gen_for->line_;
        LOOP_GUARD(gen_for);
        {
            CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
            
            // Alloca registers for names
            auto name_start = GetNextRegisterId();
            NameListData name_list_data{ false };
            gen_for->name_list_->Accept(this, &name_list_data);
            auto name_end = GetNextRegisterId();
            assert(name_start < name_end);

            // Alloca temp registers for call iterate function
            auto temp_func = GenerateRegisterId();
            auto temp_state = GenerateRegisterId();
            auto temp_var = GenerateRegisterId();

            // Call iterate function
            auto move = [=](int dst, int src) {
                auto instruction = Instruction::ABCode(OpType_Move, dst, src);
                function->AddInstruction(instruction, line);
            };
            move(temp_func, func_register);
            move(temp_state, state_register);
            move(temp_var, var_register);

            auto instruction = Instruction::ABCCode(OpType_Call, temp_func,
                                                    2 + 1,  // Two args
                                                    name_end - name_start + 1);
            function->AddInstruction(instruction, line);

            // Copy results to registers of names
            for (auto name = name_start; name < name_end; ++name, ++temp_func)
                move(name, temp_func);

            // Break the loop when the first name value is nil
            instruction = Instruction::AsBxCode(OpType_JmpNil, name_start, 0);
            int index = function->AddInstruction(instruction, line);
            AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpTail);

            // Copy first name value to var_register
            move(var_register, name_start);

            gen_for->block_->Accept(this, nullptr);
        }
        

        // Jump to loop start
        auto instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, line);
        AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpHead);
    }